

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O2

void __thiscall
asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
          (basic_streambuf<std::allocator<char>_> *this,size_t maximum_size,
          allocator<char> *allocator)

{
  pointer pcVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__basic_streambuf_001b11b0;
  this->max_size_ = maximum_size;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar2 = 0x80;
  if (maximum_size < 0x80) {
    sVar2 = maximum_size;
  }
  std::vector<char,_std::allocator<char>_>::resize(&this->buffer_,sVar2 + (sVar2 == 0));
  pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(pointer *)&this->field_0x28 = pcVar1;
  auVar3._8_4_ = (int)pcVar1;
  auVar3._0_8_ = pcVar1;
  auVar3._12_4_ = (int)((ulong)pcVar1 >> 0x20);
  *(undefined1 (*) [16])&this->field_0x18 = auVar3;
  *(undefined1 (*) [16])&this->field_0x8 = auVar3;
  *(pointer *)&this->field_0x30 = pcVar1 + sVar2;
  return;
}

Assistant:

explicit basic_streambuf(
      std::size_t maximum_size = (std::numeric_limits<std::size_t>::max)(),
      const Allocator& allocator = Allocator())
    : max_size_(maximum_size),
      buffer_(allocator)
  {
    std::size_t pend = (std::min<std::size_t>)(max_size_, buffer_delta);
    buffer_.resize((std::max<std::size_t>)(pend, 1));
    setg(&buffer_[0], &buffer_[0], &buffer_[0]);
    setp(&buffer_[0], &buffer_[0] + pend);
  }